

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O2

void __thiscall rw::Atomic::destroy(Atomic *this)

{
  PluginList::destruct((PluginList *)&s_plglist,this);
  if (this->geometry != (Geometry *)0x0) {
    Geometry::destroy(this->geometry);
  }
  setFrame(this,(Frame *)0x0);
  (*DAT_00144da0)(this);
  numAllocated = numAllocated + -1;
  return;
}

Assistant:

void
Atomic::destroy(void)
{
	s_plglist.destruct(this);
	if(this->geometry)
		this->geometry->destroy();
	assert(this->clump == nil);
	assert(this->world == nil);
	this->setFrame(nil);
	rwFree(this);
	numAllocated--;
}